

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O3

void mp::WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,1>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,SOS_1or2_Constraint<1> *sos,
               ItemNamer *vnam)

{
  ulong uVar1;
  double value;
  double value_00;
  Buffer<char> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  FormatSpec local_48;
  
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 0xe;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar4,"SOS1Constraint",0xe);
  pBVar2->size_ = uVar1;
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar4 = pBVar2->size_;
  if (sVar4 == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,sVar4 + 1);
    sVar4 = pBVar2->size_;
  }
  pBVar2->size_ = sVar4 + 1;
  pBVar2->ptr_[sVar4] = '(';
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,int>
            (wrt,&sos->v_,vnam);
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 2;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  pcVar3 = pBVar2->ptr_;
  (pcVar3 + sVar4)[0] = ',';
  (pcVar3 + sVar4)[1] = ' ';
  pBVar2->size_ = uVar1;
  WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<double,std::allocator<double>>,double>
            (wrt,&sos->w_);
  value = (sos->extra_info_).bounds_.lb_;
  value_00 = (sos->extra_info_).bounds_.ub_;
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 3;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  pcVar3 = pBVar2->ptr_;
  pcVar3[sVar4 + 2] = '[';
  pcVar3 = pcVar3 + sVar4;
  pcVar3[0] = ';';
  pcVar3[1] = ' ';
  pBVar2->size_ = uVar1;
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.precision_ = -1;
  local_48.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>(&wrt->super_BasicWriter<char>,value,&local_48);
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 2;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  pcVar3 = pBVar2->ptr_;
  (pcVar3 + sVar4)[0] = ',';
  (pcVar3 + sVar4)[1] = ' ';
  pBVar2->size_ = uVar1;
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.precision_ = -1;
  local_48.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>(&wrt->super_BasicWriter<char>,value_00,&local_48);
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 1;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  pBVar2->ptr_[sVar4] = ']';
  pBVar2->size_ = uVar1;
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar4 = pBVar2->size_;
  if (sVar4 == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,sVar4 + 1);
    sVar4 = pBVar2->size_;
  }
  pBVar2->size_ = sVar4 + 1;
  pBVar2->ptr_[sVar4] = ')';
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt, const SOS_1or2_Constraint<type>& sos,
                    ItemNamer& vnam) {
  // Type 1/2 should be in the name.
  wrt << sos.GetTypeName();
  wrt << '(';
  WriteModelItem(wrt, sos.get_vars(), vnam);
  wrt << ", ";
  WriteModelItemParameters(wrt, sos.get_weights());
  auto bnds = sos.get_sum_of_vars_range();
  wrt << "; [" << bnds.lb_ << ", " << bnds.ub_ << "]";
  wrt << ')';
}